

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PolyVertexClipTestGroup::init
          (PolyVertexClipTestGroup *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  int *piVar2;
  Context *pCVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestNode *pTVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  allocator<char> local_829;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  undefined1 local_6c8 [8];
  string name_2;
  TriangleData triangle_2;
  undefined1 local_638 [8];
  undefined1 local_630 [8];
  undefined1 local_628 [16];
  Vec4 p2_2;
  Vec4 p1_2;
  Vec4 p0_2;
  IVec3 r2_2;
  IVec3 r1_2;
  IVec3 r0_2;
  Vec4 white_3;
  float w2_2;
  float w1_2;
  float w0_2;
  int ndx3;
  int ndx2_1;
  int ndx1_1;
  TriangleData triangle_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_460 [8];
  string name_1;
  Vec4 p2_1;
  Vec4 p1_1;
  Vec4 p0_1;
  IVec3 r2_1;
  IVec3 r1_1;
  Vec3 r0_1;
  Vec4 white_2;
  float w2_1;
  float w1_1;
  float w0_1;
  int ndx2;
  int ndx1;
  TriangleData negZTriangle;
  TriangleData posZTriangle;
  Vec4 white_1;
  TriangleData triangle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string name;
  Vec4 p2;
  Vec4 p1;
  Vec4 p0;
  undefined1 local_1d4 [8];
  Vec3 r2;
  Vec3 r1;
  Vec3 r0;
  Vec4 white;
  float w2;
  float w1;
  float w0;
  int ndx;
  TestCaseGroup *clipThree;
  TestCaseGroup *clipTwo;
  TestCaseGroup *clipOne;
  Random rnd;
  IVec3 outside [26];
  float farForThreeVertex;
  float far;
  PolyVertexClipTestGroup *this_local;
  
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&rnd.m_rnd.z,-1,0,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0].m_data + 1),1,0,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[1].m_data + 1),0,1,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[2].m_data + 1),0,-1,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[3].m_data + 1),0,0,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[4].m_data + 1),0,0,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[5].m_data + 1),-1,-1,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[6].m_data + 1),1,-1,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[7].m_data + 1),1,1,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[8].m_data + 1),-1,1,0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[9].m_data + 1),-1,0,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[10].m_data + 1),1,0,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0xb].m_data + 1),1,0,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0xc].m_data + 1),-1,0,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0xd].m_data + 1),0,-1,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0xe].m_data + 1),0,1,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0xf].m_data + 1),0,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x10].m_data + 1),0,-1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x11].m_data + 1),-1,-1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x12].m_data + 1),1,-1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x13].m_data + 1),1,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x14].m_data + 1),-1,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x15].m_data + 1),-1,-1,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x16].m_data + 1),1,-1,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x17].m_data + 1),1,1,-1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(outside[0x18].m_data + 1),-1,1,-1);
  de::Random::Random((Random *)&clipOne,0xabcdef);
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"clip_one","Clip one vertex");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"clip_two","Clip two vertices");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"clip_three","Clip three vertices");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  for (w1 = 0.0; (int)w1 < 0x1a; w1 = (float)((int)w1 + 1)) {
    fVar10 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
    fVar11 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
    fVar12 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(r0.m_data + 1),1.0,1.0,1.0,1.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(r1.m_data + 1),0.2,0.3,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(r2.m_data + 1),-0.3,-0.4,0.0);
    IVec3ToVec3((anon_unknown_0 *)(p0.m_data + 2),(IVec3 *)(outside[(long)(int)w1 + -1].m_data + 1))
    ;
    tcu::operator*((tcu *)local_1d4,(Vector<float,_3> *)(p0.m_data + 2),30000.0);
    pfVar1 = r1.m_data + 1;
    fVar13 = tcu::Vector<float,_3>::x((Vector<float,_3> *)pfVar1);
    fVar14 = tcu::Vector<float,_3>::y((Vector<float,_3> *)pfVar1);
    fVar15 = tcu::Vector<float,_3>::z((Vector<float,_3> *)pfVar1);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(p1.m_data + 2),fVar13 * fVar10,fVar14 * fVar10,fVar15 * fVar10,
               fVar10);
    pfVar1 = r2.m_data + 1;
    fVar10 = tcu::Vector<float,_3>::x((Vector<float,_3> *)pfVar1);
    fVar13 = tcu::Vector<float,_3>::y((Vector<float,_3> *)pfVar1);
    fVar14 = tcu::Vector<float,_3>::z((Vector<float,_3> *)pfVar1);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(p2.m_data + 2),fVar10 * fVar11,fVar13 * fVar11,fVar14 * fVar11,
               fVar11);
    fVar10 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_1d4);
    fVar11 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_1d4);
    fVar13 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_1d4);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)((long)&name.field_2 + 8),fVar10 * fVar12,fVar11 * fVar12,
               fVar13 * fVar12,fVar12);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(triangle.c2.m_data + 3),"clip",
               (allocator<char> *)((long)triangle.c2.m_data + 0xb));
    iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
    if (iVar5 < 1) {
      iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
      local_8b0 = "";
      if (iVar5 < 0) {
        local_8b0 = "_neg_x";
      }
    }
    else {
      local_8b0 = "_pos_x";
    }
    std::operator+(&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (triangle.c2.m_data + 3),local_8b0);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
    if (iVar5 < 1) {
      iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
      local_8b8 = "";
      if (iVar5 < 0) {
        local_8b8 = "_neg_y";
      }
    }
    else {
      local_8b8 = "_pos_y";
    }
    std::operator+(&local_250,&local_270,local_8b8);
    iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
    if (iVar5 < 1) {
      iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
      local_8c0 = "";
      if (iVar5 < 0) {
        local_8c0 = "_neg_z";
      }
    }
    else {
      local_8c0 = "_pos_z";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   &local_250,local_8c0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)(triangle.c2.m_data + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)triangle.c2.m_data + 0xb));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(white_1.m_data + 3),(Vector<float,_4> *)(p1.m_data + 2));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(triangle.p0.m_data + 2),(Vector<float,_4> *)(r0.m_data + 1));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(triangle.c0.m_data + 2),(Vector<float,_4> *)(p2.m_data + 2));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(triangle.p1.m_data + 2),(Vector<float,_4> *)(r0.m_data + 1));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(triangle.c1.m_data + 2),
               (Vector<float,_4> *)((long)&name.field_2 + 8));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(triangle.p2.m_data + 2),(Vector<float,_4> *)(r0.m_data + 1));
    iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1));
    if ((iVar5 == 0) &&
       (iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w1 + -1].m_data + 1)),
       iVar5 == 0)) {
      white_1.m_data[2] = 5.60519e-45;
    }
    else {
      pTVar8 = (TestNode *)operator_new(0xa0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      TriangleCase::TriangleCase
                ((TriangleCase *)pTVar8,pCVar3,pcVar9,"clip one vertex",
                 (TriangleData *)(white_1.m_data + 3),(TriangleData *)(triangle.c2.m_data + 2),
                 (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
      tcu::TestNode::addChild((TestNode *)this_00,pTVar8);
      white_1.m_data[2] = 0.0;
    }
    std::__cxx11::string::~string((string *)local_230);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(posZTriangle.c2.m_data + 2),1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(negZTriangle.c2.m_data + 2),0.0,-0.7,-0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(posZTriangle.p0.m_data + 2),
             (Vector<float,_4> *)(posZTriangle.c2.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(posZTriangle.c0.m_data + 2),0.8,0.0,-0.7,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(posZTriangle.p1.m_data + 2),
             (Vector<float,_4> *)(posZTriangle.c2.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(posZTriangle.c1.m_data + 2),-0.9,0.9,3.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(posZTriangle.p2.m_data + 2),
             (Vector<float,_4> *)(posZTriangle.c2.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&ndx2,0.0,-0.7,0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(negZTriangle.p0.m_data + 2),
             (Vector<float,_4> *)(posZTriangle.c2.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(negZTriangle.c0.m_data + 2),0.4,0.0,0.7,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(negZTriangle.p1.m_data + 2),
             (Vector<float,_4> *)(posZTriangle.c2.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(negZTriangle.c1.m_data + 2),-0.9,0.9,-3.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(negZTriangle.p2.m_data + 2),
             (Vector<float,_4> *)(posZTriangle.c2.m_data + 2));
  pTVar8 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar8,(this->super_TestCaseGroup).m_context,"clip_pos_z",
             "clip one vertex",(TriangleData *)(negZTriangle.c2.m_data + 2),
             (TriangleData *)(posZTriangle.c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this_00,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar8,(this->super_TestCaseGroup).m_context,"clip_neg_z",
             "clip one vertex",(TriangleData *)&ndx2,(TriangleData *)(negZTriangle.c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this_00,pTVar8);
  for (w0_1 = 0.0; w1_1 = w0_1, (int)w0_1 < 0x1a; w0_1 = (float)((int)w0_1 + 1)) {
    while (w1_1 = (float)((int)w1_1 + 1), (int)w1_1 < 0x1a) {
      fVar10 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
      fVar11 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
      fVar12 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(r0_1.m_data + 1),1.0,1.0,1.0,1.0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(r1_1.m_data + 1),0.2,0.3,0.0);
      tcu::Vector<int,_3>::Vector
                ((Vector<int,_3> *)(r2_1.m_data + 1),
                 (Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1));
      tcu::Vector<int,_3>::Vector
                ((Vector<int,_3> *)(p0_1.m_data + 2),
                 (Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1));
      piVar2 = r1_1.m_data + 1;
      fVar13 = tcu::Vector<float,_3>::x((Vector<float,_3> *)piVar2);
      fVar14 = tcu::Vector<float,_3>::y((Vector<float,_3> *)piVar2);
      fVar15 = tcu::Vector<float,_3>::z((Vector<float,_3> *)piVar2);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(p1_1.m_data + 2),fVar13 * fVar10,fVar14 * fVar10,
                 fVar15 * fVar10,fVar10);
      piVar2 = r2_1.m_data + 1;
      iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)piVar2);
      iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)piVar2);
      iVar7 = tcu::Vector<int,_3>::z((Vector<int,_3> *)piVar2);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(p2_1.m_data + 2),(float)iVar5 * 30000.0 * fVar11,
                 (float)iVar6 * 30000.0 * fVar11,(float)iVar7 * 30000.0 * fVar11,fVar11);
      pfVar1 = p0_1.m_data + 2;
      iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)pfVar1);
      iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)pfVar1);
      iVar7 = tcu::Vector<int,_3>::z((Vector<int,_3> *)pfVar1);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)((long)&name_1.field_2 + 8),(float)iVar5 * 30000.0 * fVar12,
                 (float)iVar6 * 30000.0 * fVar12,(float)iVar7 * 30000.0 * fVar12,fVar12);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(triangle_1.c2.m_data + 3),"clip",
                 (allocator<char> *)((long)triangle_1.c2.m_data + 0xb));
      iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1));
      if (iVar5 < 1) {
        iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1))
        ;
        local_958 = "";
        if (iVar5 < 0) {
          local_958 = "_neg_x";
        }
      }
      else {
        local_958 = "_pos_x";
      }
      std::operator+(&local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (triangle_1.c2.m_data + 3),local_958);
      iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1));
      if (iVar5 < 1) {
        iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1))
        ;
        local_960 = "";
        if (iVar5 < 0) {
          local_960 = "_neg_y";
        }
      }
      else {
        local_960 = "_pos_y";
      }
      std::operator+(&local_500,&local_520,local_960);
      iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1));
      if (iVar5 < 1) {
        iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)(int)w0_1 + -1].m_data + 1))
        ;
        local_968 = "";
        if (iVar5 < 0) {
          local_968 = "_neg_z";
        }
      }
      else {
        local_968 = "_pos_z";
      }
      std::operator+(&local_4e0,&local_500,local_968);
      std::operator+(&local_4c0,&local_4e0,"_and");
      iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1));
      if (iVar5 < 1) {
        iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1))
        ;
        local_970 = "";
        if (iVar5 < 0) {
          local_970 = "_neg_x";
        }
      }
      else {
        local_970 = "_pos_x";
      }
      std::operator+(&local_4a0,&local_4c0,local_970);
      iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1));
      if (iVar5 < 1) {
        iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1))
        ;
        local_978 = "";
        if (iVar5 < 0) {
          local_978 = "_neg_y";
        }
      }
      else {
        local_978 = "_pos_y";
      }
      std::operator+(&local_480,&local_4a0,local_978);
      iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1));
      if (iVar5 < 1) {
        iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)(int)w1_1 + -1].m_data + 1))
        ;
        local_980 = "";
        if (iVar5 < 0) {
          local_980 = "_neg_z";
        }
      }
      else {
        local_980 = "_pos_z";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     &local_480,local_980);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)(triangle_1.c2.m_data + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)triangle_1.c2.m_data + 0xb));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&ndx2_1,(Vector<float,_4> *)(p1_1.m_data + 2));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(triangle_1.p0.m_data + 2),
                 (Vector<float,_4> *)(r0_1.m_data + 1));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(triangle_1.c0.m_data + 2),
                 (Vector<float,_4> *)(p2_1.m_data + 2));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(triangle_1.p1.m_data + 2),
                 (Vector<float,_4> *)(r0_1.m_data + 1));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(triangle_1.c1.m_data + 2),
                 (Vector<float,_4> *)((long)&name_1.field_2 + 8));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(triangle_1.p2.m_data + 2),
                 (Vector<float,_4> *)(r0_1.m_data + 1));
      bVar4 = twoPointClippedTriangleInvisible
                        ((Vec3 *)(r1_1.m_data + 1),(IVec3 *)(r2_1.m_data + 1),
                         (IVec3 *)(p0_1.m_data + 2));
      if (bVar4) {
        white_1.m_data[2] = 1.4013e-44;
      }
      else {
        pTVar8 = (TestNode *)operator_new(0xa0);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        TriangleCase::TriangleCase
                  ((TriangleCase *)pTVar8,pCVar3,pcVar9,"clip two vertices",(TriangleData *)&ndx2_1,
                   (TriangleData *)(triangle_1.c2.m_data + 2),
                   (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
        tcu::TestNode::addChild((TestNode *)this_01,pTVar8);
        white_1.m_data[2] = 0.0;
      }
      std::__cxx11::string::~string((string *)local_460);
    }
  }
  for (ndx3 = 0; fVar10 = (float)ndx3, ndx3 < 0x1a; ndx3 = ndx3 + 1) {
    while (w0_2 = (float)((int)fVar10 + 1), (int)w0_2 < 0x1a) {
      for (w1_2 = (float)((int)fVar10 + 2); fVar10 = w0_2, (int)w1_2 < 0x1a;
          w1_2 = (float)((int)w1_2 + 1)) {
        fVar10 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
        fVar11 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
        fVar12 = de::Random::getFloat((Random *)&clipOne,0.2,16.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(r0_2.m_data + 1),1.0,1.0,1.0,1.0);
        tcu::Vector<int,_3>::Vector
                  ((Vector<int,_3> *)(r1_2.m_data + 1),
                   (Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
        tcu::Vector<int,_3>::Vector
                  ((Vector<int,_3> *)(r2_2.m_data + 1),
                   (Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
        tcu::Vector<int,_3>::Vector
                  ((Vector<int,_3> *)(p0_2.m_data + 2),
                   (Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
        piVar2 = r1_2.m_data + 1;
        iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)piVar2);
        iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)piVar2);
        iVar7 = tcu::Vector<int,_3>::z((Vector<int,_3> *)piVar2);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(p1_2.m_data + 2),(float)iVar5 * 20000.0 * fVar10,
                   (float)iVar6 * 20000.0 * fVar10,(float)iVar7 * 20000.0 * fVar10,fVar10);
        piVar2 = r2_2.m_data + 1;
        iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)piVar2);
        iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)piVar2);
        iVar7 = tcu::Vector<int,_3>::z((Vector<int,_3> *)piVar2);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(p2_2.m_data + 2),(float)iVar5 * 20000.0 * fVar11,
                   (float)iVar6 * 20000.0 * fVar11,(float)iVar7 * 20000.0 * fVar11,fVar11);
        pfVar1 = p0_2.m_data + 2;
        iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)pfVar1);
        iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)pfVar1);
        iVar7 = tcu::Vector<int,_3>::z((Vector<int,_3> *)pfVar1);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(local_628 + 8),(float)iVar5 * 20000.0 * fVar12,
                   (float)iVar6 * 20000.0 * fVar12,(float)iVar7 * 20000.0 * fVar12,fVar12);
        tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_628,(int)&r1_2 + 4,0);
        tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_630,(int)&r2_2 + 4,0);
        tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_638,(int)&p0_2 + 8,0);
        bVar4 = pointsOnLine((IVec2 *)local_628,(IVec2 *)local_630,(IVec2 *)local_638);
        if (!bVar4) {
          tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(triangle_2.c2.m_data + 2),0,0,0);
          bVar4 = pointOnTriangle((IVec3 *)(triangle_2.c2.m_data + 2),(IVec3 *)(r1_2.m_data + 1),
                                  (IVec3 *)(r2_2.m_data + 1),(IVec3 *)(p0_2.m_data + 2));
          if (bVar4) {
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)((long)&name_2.field_2 + 0xc),
                       (Vector<float,_4> *)(p1_2.m_data + 2));
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(triangle_2.p0.m_data + 2),
                       (Vector<float,_4> *)(r0_2.m_data + 1));
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(triangle_2.c0.m_data + 2),
                       (Vector<float,_4> *)(p2_2.m_data + 2));
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(triangle_2.p1.m_data + 2),
                       (Vector<float,_4> *)(r0_2.m_data + 1));
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(triangle_2.c1.m_data + 2),
                       (Vector<float,_4> *)(local_628 + 8));
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(triangle_2.p2.m_data + 2),
                       (Vector<float,_4> *)(r0_2.m_data + 1));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_828,"clip",&local_829);
            iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::x
                                ((Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
              local_a08 = "";
              if (iVar5 < 0) {
                local_a08 = "_neg_x";
              }
            }
            else {
              local_a08 = "_pos_x";
            }
            std::operator+(&local_808,&local_828,local_a08);
            iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::y
                                ((Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
              local_a10 = "";
              if (iVar5 < 0) {
                local_a10 = "_neg_y";
              }
            }
            else {
              local_a10 = "_pos_y";
            }
            std::operator+(&local_7e8,&local_808,local_a10);
            iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::z
                                ((Vector<int,_3> *)(outside[(long)ndx3 + -1].m_data + 1));
              local_a18 = "";
              if (iVar5 < 0) {
                local_a18 = "_neg_z";
              }
            }
            else {
              local_a18 = "_pos_z";
            }
            std::operator+(&local_7c8,&local_7e8,local_a18);
            std::operator+(&local_7a8,&local_7c8,"_and");
            iVar5 = tcu::Vector<int,_3>::x
                              ((Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::x
                                ((Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
              local_a20 = "";
              if (iVar5 < 0) {
                local_a20 = "_neg_x";
              }
            }
            else {
              local_a20 = "_pos_x";
            }
            std::operator+(&local_788,&local_7a8,local_a20);
            iVar5 = tcu::Vector<int,_3>::y
                              ((Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::y
                                ((Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
              local_a28 = "";
              if (iVar5 < 0) {
                local_a28 = "_neg_y";
              }
            }
            else {
              local_a28 = "_pos_y";
            }
            std::operator+(&local_768,&local_788,local_a28);
            iVar5 = tcu::Vector<int,_3>::z
                              ((Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::z
                                ((Vector<int,_3> *)(outside[(long)(int)w0_2 + -1].m_data + 1));
              local_a30 = "";
              if (iVar5 < 0) {
                local_a30 = "_neg_z";
              }
            }
            else {
              local_a30 = "_pos_z";
            }
            std::operator+(&local_748,&local_768,local_a30);
            std::operator+(&local_728,&local_748,"_and");
            iVar5 = tcu::Vector<int,_3>::x
                              ((Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::x
                                ((Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
              local_a38 = "";
              if (iVar5 < 0) {
                local_a38 = "_neg_x";
              }
            }
            else {
              local_a38 = "_pos_x";
            }
            std::operator+(&local_708,&local_728,local_a38);
            iVar5 = tcu::Vector<int,_3>::y
                              ((Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::y
                                ((Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
              local_a40 = "";
              if (iVar5 < 0) {
                local_a40 = "_neg_y";
              }
            }
            else {
              local_a40 = "_pos_y";
            }
            std::operator+(&local_6e8,&local_708,local_a40);
            iVar5 = tcu::Vector<int,_3>::z
                              ((Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
            if (iVar5 < 1) {
              iVar5 = tcu::Vector<int,_3>::z
                                ((Vector<int,_3> *)(outside[(long)(int)w1_2 + -1].m_data + 1));
              local_a48 = "";
              if (iVar5 < 0) {
                local_a48 = "_neg_z";
              }
            }
            else {
              local_a48 = "_pos_z";
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_6c8,&local_6e8,local_a48);
            std::__cxx11::string::~string((string *)&local_6e8);
            std::__cxx11::string::~string((string *)&local_708);
            std::__cxx11::string::~string((string *)&local_728);
            std::__cxx11::string::~string((string *)&local_748);
            std::__cxx11::string::~string((string *)&local_768);
            std::__cxx11::string::~string((string *)&local_788);
            std::__cxx11::string::~string((string *)&local_7a8);
            std::__cxx11::string::~string((string *)&local_7c8);
            std::__cxx11::string::~string((string *)&local_7e8);
            std::__cxx11::string::~string((string *)&local_808);
            std::__cxx11::string::~string((string *)&local_828);
            std::allocator<char>::~allocator(&local_829);
            pTVar8 = (TestNode *)operator_new(0xa0);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            pcVar9 = (char *)std::__cxx11::string::c_str();
            TriangleCase::TriangleCase
                      ((TriangleCase *)pTVar8,pCVar3,pcVar9,"clip three vertices",
                       (TriangleData *)((long)&name_2.field_2 + 0xc),
                       (TriangleData *)(triangle_2.c2.m_data + 2),
                       (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
            tcu::TestNode::addChild((TestNode *)this_02,pTVar8);
            std::__cxx11::string::~string((string *)local_6c8);
          }
        }
      }
    }
  }
  de::Random::~Random((Random *)&clipOne);
  return extraout_EAX;
}

Assistant:

void PolyVertexClipTestGroup::init (void)
{
	const float far					= 30000.0f;
	const float farForThreeVertex	= 20000.0f; // 3 vertex clipping tests use smaller triangles
	const tcu::IVec3 outside[] =
	{
		// outside one clipping plane
		tcu::IVec3(-1,  0,  0),
		tcu::IVec3( 1,  0,  0),
		tcu::IVec3( 0,  1,  0),
		tcu::IVec3( 0, -1,  0),
		tcu::IVec3( 0,  0,  1),
		tcu::IVec3( 0,  0, -1),

		// outside two clipping planes
		tcu::IVec3(-1, -1,  0),
		tcu::IVec3( 1, -1,  0),
		tcu::IVec3( 1,  1,  0),
		tcu::IVec3(-1,  1,  0),

		tcu::IVec3(-1,  0, -1),
		tcu::IVec3( 1,  0, -1),
		tcu::IVec3( 1,  0,  1),
		tcu::IVec3(-1,  0,  1),

		tcu::IVec3( 0, -1, -1),
		tcu::IVec3( 0,  1, -1),
		tcu::IVec3( 0,  1,  1),
		tcu::IVec3( 0, -1,  1),

		// outside three clipping planes
		tcu::IVec3(-1, -1,  1),
		tcu::IVec3( 1, -1,  1),
		tcu::IVec3( 1,  1,  1),
		tcu::IVec3(-1,  1,  1),

		tcu::IVec3(-1, -1, -1),
		tcu::IVec3( 1, -1, -1),
		tcu::IVec3( 1,  1, -1),
		tcu::IVec3(-1,  1, -1),
	};

	de::Random rnd(0xabcdef);

	TestCaseGroup* clipOne		= new TestCaseGroup(m_context, "clip_one",		"Clip one vertex");
	TestCaseGroup* clipTwo		= new TestCaseGroup(m_context, "clip_two",		"Clip two vertices");
	TestCaseGroup* clipThree	= new TestCaseGroup(m_context, "clip_three",	"Clip three vertices");

	addChild(clipOne);
	addChild(clipTwo);
	addChild(clipThree);

	// Test 1 point clipped
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(outside); ++ndx)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::Vec3 r1		= tcu::Vec3(-0.3f,	-0.4f,	0);
		const tcu::Vec3 r2		= IVec3ToVec3(outside[ndx]) * far;
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(r1.x() * w1, r1.y() * w1, r1.z() * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(r2.x() * w2, r2.y() * w2, r2.z() * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx].x() > 0 ? "_pos_x" : (outside[ndx].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx].y() > 0 ? "_pos_y" : (outside[ndx].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx].z() > 0 ? "_pos_z" : (outside[ndx].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		// don't try to test with degenerate (or almost degenerate) triangles
		if (outside[ndx].x() == 0 && outside[ndx].y() == 0)
			continue;

		clipOne->addChild(new TriangleCase(m_context, name.c_str(), "clip one vertex", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Special triangles for "clip_z" cases, default triangles is not good, since it has very small visible area => problems with MSAA
	{
		const tcu::Vec4 white = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

		const TriangleCase::TriangleData posZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f, -0.9f, 1.0f), white,
			tcu::Vec4( 0.8f,  0.0f, -0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f,  3.0f, 1.0f), white
		};
		const TriangleCase::TriangleData negZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f,  0.9f, 1.0f), white,
			tcu::Vec4( 0.4f,  0.0f,  0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f, -3.0f, 1.0f), white
		};

		clipOne->addChild(new TriangleCase(m_context, "clip_pos_z", "clip one vertex", &posZTriangle, &posZTriangle + 1, VIEWPORT_CENTER));
		clipOne->addChild(new TriangleCase(m_context, "clip_neg_z", "clip one vertex", &negZTriangle, &negZTriangle + 1, VIEWPORT_CENTER));
	}

	// Test 2 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::IVec3 r1		= outside[ndx1];
		const tcu::IVec3 r2		= outside[ndx2];
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * far * w1, float(r1.y()) * far * w1, float(r1.z()) * far * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * far * w2, float(r2.y()) * far * w2, float(r2.z()) * far * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
			"_and" +
			(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		if (twoPointClippedTriangleInvisible(r0, r1, r2))
			continue;

		clipTwo->addChild(new TriangleCase(m_context, name.c_str(), "clip two vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Test 3 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	for (int ndx3 = ndx2 + 1; ndx3 < DE_LENGTH_OF_ARRAY(outside); ++ndx3)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(1, 1, 1, 1);
		const tcu::IVec3 r0		= outside[ndx1];
		const tcu::IVec3 r1		= outside[ndx2];
		const tcu::IVec3 r2		= outside[ndx3];
		const tcu::Vec4 p0		= tcu::Vec4(float(r0.x()) * farForThreeVertex * w0, float(r0.y()) * farForThreeVertex * w0, float(r0.z()) * farForThreeVertex * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * farForThreeVertex * w1, float(r1.y()) * farForThreeVertex * w1, float(r1.z()) * farForThreeVertex * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * farForThreeVertex * w2, float(r2.y()) * farForThreeVertex * w2, float(r2.z()) * farForThreeVertex * w2, w2);

		// ignore cases where polygon is along xz or yz planes
		if (pointsOnLine(r0.swizzle(0, 1), r1.swizzle(0, 1), r2.swizzle(0, 1)))
			continue;

		// triangle is visible only if it intersects the origin
		if (pointOnTriangle(tcu::IVec3(0, 0, 0), r0, r1, r2))
		{
			const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};
			const std::string name	= std::string("clip") +
				(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx3].x() > 0 ? "_pos_x" : (outside[ndx3].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx3].y() > 0 ? "_pos_y" : (outside[ndx3].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx3].z() > 0 ? "_pos_z" : (outside[ndx3].z() < 0 ? "_neg_z" : ""));

			clipThree->addChild(new TriangleCase(m_context, name.c_str(), "clip three vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
		}
	}
}